

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicSemaphoreTests.cpp
# Opt level: O3

TestStatus *
vkt::synchronization::anon_unknown_0::basicMultiQueueCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkFence obj;
  VkCommandPool obj_00;
  byte bVar1;
  ulong uVar2;
  Handle<(vk::HandleType)24> HVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkAllocationCallbacks *pVVar6;
  undefined4 uVar7;
  undefined8 device;
  bool bVar8;
  byte bVar9;
  VkResult VVar10;
  int iVar11;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this;
  undefined8 uVar12;
  bool bVar13;
  undefined4 uVar14;
  long *plVar15;
  byte bVar16;
  long *plVar17;
  undefined8 *puVar18;
  ulong *puVar19;
  VkDeviceQueueCreateInfo *pVVar20;
  TestStatus *pTVar21;
  long lVar22;
  pointer pVVar23;
  byte bVar24;
  VkSubmitInfo swapInfo;
  Queues queues [2];
  VkPipelineStageFlags stageBits [1];
  Move<vk::VkCommandBuffer_s_*> cmdBuffer [2];
  Move<vk::Handle<(vk::HandleType)6>_> fence [2];
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  float queuePriorities [2];
  VkCommandBufferBeginInfo info;
  VkDeviceCreateInfo deviceInfo;
  VkDeviceQueueCreateInfo queueInfos [2];
  VkPhysicalDeviceFeatures deviceFeatures;
  Move<vk::Handle<(vk::HandleType)24>_> local_418;
  undefined1 local_3f8 [20];
  undefined4 uStack_3e4;
  undefined8 uStack_3e0;
  pointer local_3a8;
  pointer local_3a0;
  VkAllocationCallbacks *local_398;
  TestStatus *local_390;
  undefined8 local_388;
  ulong uStack_380;
  undefined8 local_378;
  ulong uStack_370;
  VkAllocationCallbacks *local_368;
  undefined4 local_35c;
  pointer local_358;
  long *plStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  pointer local_338;
  pointer pVStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  VkSemaphore local_318;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_310;
  VkFence local_2f8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_2f0;
  VkFence local_2d8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_2d0;
  VkCommandPool local_2b8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_2b0;
  VkCommandPool local_298;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_290;
  float local_278 [2];
  pointer local_270;
  long local_268 [2];
  undefined4 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined4 local_240;
  pointer *local_238;
  undefined4 local_230;
  VkSemaphore *local_228;
  undefined4 local_220 [2];
  undefined8 local_218;
  undefined4 local_210;
  VkSemaphore *local_208;
  undefined4 *local_200;
  undefined4 local_1f8;
  pointer *local_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  VkDeviceCreateInfo local_1b8;
  VkDeviceQueueCreateInfo local_168;
  VkDeviceQueueCreateInfo local_140;
  VkPhysicalDeviceFeatures local_10c;
  
  bVar24 = 0;
  local_390 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  vk_00 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  local_278[0] = 1.0;
  local_278[1] = 1.0;
  local_378 = 0;
  uStack_370 = 0xffffffff;
  local_388 = 0;
  uStack_380 = 0xffffffff;
  local_1c8 = 4;
  uStack_1c0 = 0;
  local_1d8 = 0x2a;
  uStack_1d0 = 0;
  DStack_310.m_device = (VkDevice)0x0;
  DStack_310.m_allocator = (VkAllocationCallbacks *)0x0;
  local_318.m_internal = 0;
  DStack_310.m_deviceIface = (DeviceInterface *)0x0;
  DStack_290.m_device = (VkDevice)0x0;
  DStack_290.m_allocator = (VkAllocationCallbacks *)0x0;
  local_298.m_internal = 0;
  DStack_290.m_deviceIface = (DeviceInterface *)0x0;
  DStack_2b0.m_device = (VkDevice)0x0;
  DStack_2b0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2b8.m_internal = 0;
  DStack_2b0.m_deviceIface = (DeviceInterface *)0x0;
  local_328 = 0;
  uStack_320 = 0;
  local_338 = (pointer)0x0;
  pVStack_330 = (pointer)0x0;
  local_348 = 0;
  uStack_340 = 0;
  local_358 = (pointer)0x0;
  plStack_350 = (long *)0x0;
  local_35c = 1;
  DStack_2d0.m_device = (VkDevice)0x0;
  DStack_2d0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2d8.m_internal = 0;
  DStack_2d0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_2f0.m_device = (VkDevice)0x0;
  DStack_2f0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_2f8.m_internal = 0;
  DStack_2f0.m_deviceIface = (DeviceInterface *)0x0;
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_3f8,vk_00,physicalDevice);
  local_368 = stack0xfffffffffffffc18;
  local_3a8 = (pointer)local_3f8._0_8_;
  if (local_3f8._8_8_ - local_3f8._0_8_ != 0) {
    uStack_380 = uStack_380 & 0xffffffff00000000;
    bVar9 = 0;
    uVar14 = 0;
    if (*(deUint32 *)(local_3f8._0_8_ + 4) < 2) {
      if ((ulong)(((long)(local_3f8._8_8_ - local_3f8._0_8_) >> 3) * -0x5555555555555555) < 2)
      goto LAB_007d55e5;
      uVar14 = 1;
      bVar9 = 1;
    }
    uStack_370 = CONCAT44(uStack_370._4_4_,uVar14);
    bVar16 = 1;
    puVar19 = &uStack_380;
    pVVar20 = &local_168;
    do {
      uVar2 = *puVar19;
      pVVar20->sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      *(undefined8 *)&pVVar20->field_0x4 = 0;
      *(undefined8 *)((long)&pVVar20->pNext + 4) = 0;
      pVVar20->queueFamilyIndex = (deUint32)uVar2;
      pVVar20->queueCount = 2 - bVar9;
      *(undefined4 *)&pVVar20->field_0x1c = 0;
      pVVar20->pQueuePriorities = local_278;
      bVar1 = bVar9 & bVar16;
      bVar16 = 0;
      puVar19 = &uStack_370;
      pVVar20 = &local_140;
    } while (bVar1 != 0);
    local_1b8._48_8_ = 0;
    local_1b8.ppEnabledExtensionNames = (char **)0x0;
    local_1b8._32_8_ = 0;
    local_1b8.ppEnabledLayerNames = (char **)0x0;
    local_1b8.flags = 0;
    local_1b8.queueCreateInfoCount = 0;
    local_1b8.pQueueCreateInfos = (VkDeviceQueueCreateInfo *)0x0;
    local_1b8.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_1b8._4_4_ = 0;
    local_1b8.pNext = (void *)0x0;
    local_1b8.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
    local_398 = (VkAllocationCallbacks *)0x0;
    local_3a0 = (pointer)0x0;
    (*vk_00->_vptr_InstanceInterface[2])(vk_00,physicalDevice,&local_10c);
    local_1b8.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    local_1b8.pNext = (void *)0x0;
    local_1b8._48_8_ = local_1b8._48_8_ & 0xffffffff00000000;
    local_1b8.ppEnabledExtensionNames = (char **)0x0;
    local_1b8._32_8_ = local_1b8._32_8_ & 0xffffffff00000000;
    local_1b8.ppEnabledLayerNames = (char **)0x0;
    local_1b8.queueCreateInfoCount = ((deUint32)uStack_380 != (deUint32)uStack_370) + 1;
    local_1b8.pQueueCreateInfos = &local_168;
    local_1b8.pEnabledFeatures = &local_10c;
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)local_3f8,vk_00,physicalDevice,&local_1b8,
                       (VkAllocationCallbacks *)0x0);
    device = local_3f8._0_8_;
    local_3a0 = (pointer)local_3f8._8_8_;
    local_398 = stack0xfffffffffffffc18;
    uVar12 = 0;
    puVar18 = &local_388;
    bVar8 = true;
    do {
      bVar13 = bVar8;
      if ((deUint32)uStack_380 != (deUint32)uStack_370) {
        uVar12 = 0;
      }
      (*vk->_vptr_DeviceInterface[1])(vk,local_3f8._0_8_,(ulong)*(uint *)(puVar18 + 1),uVar12);
      uVar12 = 1;
      puVar18 = &local_378;
      bVar8 = false;
    } while (bVar13);
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&local_418,vk,(VkDevice)local_3f8._0_8_,0,
               (VkAllocationCallbacks *)0x0);
    pVVar6 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
    pVVar5 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    stack0xfffffffffffffc18 =
         (VkAllocationCallbacks *)
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    uStack_3e0 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
    ;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_318.m_internal == 0) {
      DStack_310.m_device = pVVar5;
      DStack_310.m_allocator = pVVar6;
      local_318.m_internal = HVar3.m_internal;
      DStack_310.m_deviceIface = pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_310,local_318);
      local_318.m_internal = local_3f8._0_8_;
      DStack_310.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
      DStack_310.m_device = (VkDevice)stack0xfffffffffffffc18;
      DStack_310.m_allocator = uStack_3e0;
      if (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)4>_> *)
                   &local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkSemaphore)
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                  );
      }
    }
    ::vk::createCommandPool
              (&local_418,vk,(VkDevice)device,2,(deUint32)uStack_380,(VkAllocationCallbacks *)0x0);
    pVVar6 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
    pVVar5 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    stack0xfffffffffffffc18 =
         (VkAllocationCallbacks *)
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    uStack_3e0 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
    ;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_2b8.m_internal == 0) {
      DStack_2b0.m_device = pVVar5;
      DStack_2b0.m_allocator = pVVar6;
      local_2b8.m_internal = HVar3.m_internal;
      DStack_2b0.m_deviceIface = pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_2b0,local_2b8);
      local_2b8.m_internal = local_3f8._0_8_;
      DStack_2b0.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
      DStack_2b0.m_device = (VkDevice)stack0xfffffffffffffc18;
      DStack_2b0.m_allocator = uStack_3e0;
      if (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkCommandPool)
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                  );
      }
    }
    ::vk::createCommandPool
              (&local_418,vk,(VkDevice)device,2,(deUint32)uStack_370,(VkAllocationCallbacks *)0x0);
    pVVar6 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
    pVVar5 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    stack0xfffffffffffffc18 =
         (VkAllocationCallbacks *)
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    uStack_3e0 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
    ;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_298.m_internal == 0) {
      DStack_290.m_device = pVVar5;
      DStack_290.m_allocator = pVVar6;
      local_298.m_internal = HVar3.m_internal;
      DStack_290.m_deviceIface = pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_290,local_298);
      DStack_290.m_device = (VkDevice)stack0xfffffffffffffc18;
      DStack_290.m_allocator = uStack_3e0;
      local_298.m_internal = local_3f8._0_8_;
      DStack_290.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
      if (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkCommandPool)
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                  );
      }
    }
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_418,vk,(VkDevice)device,local_2b8);
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    uVar14 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device._4_4_;
    uVar7 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator.
            _4_4_;
    local_3f8._16_4_ =
         SUB84(local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,0);
    uStack_3e4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device.
                 _4_4_;
    uStack_3e0._0_4_ =
         SUB84(local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0
              );
    uStack_3e0._4_4_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_358 == (pointer)0x0) {
      local_348._4_4_ = uVar14;
      uStack_340._4_4_ = uVar7;
      local_358 = (pointer)HVar3.m_internal;
      plStack_350 = (long *)pDVar4;
      local_348._0_4_ = local_3f8._16_4_;
      uStack_340._0_4_ = (undefined4)uStack_3e0;
    }
    else {
      local_270 = local_358;
      (**(code **)(*plStack_350 + 0x240))(plStack_350,local_348,uStack_340,1);
      local_358 = (pointer)local_3f8._0_8_;
      plStack_350 = (long *)local_3f8._8_8_;
      local_348._0_4_ = local_3f8._16_4_;
      local_348._4_4_ = uStack_3e4;
      uStack_340._0_4_ = (undefined4)uStack_3e0;
      uStack_340._4_4_ = uStack_3e0._4_4_;
      if ((VkCommandBuffer)
          local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
          (VkCommandBuffer)0x0) {
        local_3f8._0_8_ =
             local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
        (*(local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
          _vptr_DeviceInterface[0x48])
                  (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                   m_deviceIface,
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                   m_allocator,1);
      }
    }
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_418,vk,(VkDevice)device,local_298);
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    uVar14 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device._4_4_;
    uVar7 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator.
            _4_4_;
    local_3f8._16_4_ =
         SUB84(local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,0);
    uStack_3e4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device.
                 _4_4_;
    uStack_3e0._0_4_ =
         SUB84(local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0
              );
    uStack_3e0._4_4_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_338 == (pointer)0x0) {
      local_328._4_4_ = uVar14;
      uStack_320._4_4_ = uVar7;
      local_338 = (pointer)HVar3.m_internal;
      pVStack_330 = (pointer)pDVar4;
      local_328._0_4_ = local_3f8._16_4_;
      uStack_320._0_4_ = (undefined4)uStack_3e0;
    }
    else {
      local_270 = local_338;
      (**(code **)(*(long *)pVStack_330 + 0x240))(pVStack_330,local_328,uStack_320);
      local_328._0_4_ = local_3f8._16_4_;
      local_328._4_4_ = uStack_3e4;
      uStack_320._0_4_ = (undefined4)uStack_3e0;
      uStack_320._4_4_ = uStack_3e0._4_4_;
      local_338 = (pointer)local_3f8._0_8_;
      pVStack_330 = (pointer)local_3f8._8_8_;
      if ((VkCommandBuffer)
          local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
          (VkCommandBuffer)0x0) {
        local_3f8._0_8_ =
             local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
        (*(local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
          _vptr_DeviceInterface[0x48])
                  (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                   m_deviceIface,
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
                   local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                   m_allocator);
      }
    }
    local_268[0] = CONCAT44(local_268[0]._4_4_,4);
    local_268[1] = 0;
    local_258 = 0;
    local_250 = 0;
    uStack_248 = 0;
    local_240 = 1;
    local_230 = 1;
    local_228 = &local_318;
    local_220[0] = 4;
    local_218 = 0;
    local_210 = 1;
    local_200 = &local_35c;
    local_1f8 = 1;
    local_1e8 = 0;
    local_1e0 = 0;
    local_238 = &local_358;
    local_208 = local_228;
    local_1f0 = &local_338;
    VVar10 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_358,&local_1d8);
    ::vk::checkResult(VVar10,"vk.beginCommandBuffer(*cmdBuffer[FIRST], &info)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                      ,0xe0);
    endCommandBuffer(vk,(VkCommandBuffer)local_358);
    VVar10 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_338,&local_1d8);
    ::vk::checkResult(VVar10,"vk.beginCommandBuffer(*cmdBuffer[SECOND], &info)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                      ,0xe2);
    endCommandBuffer(vk,(VkCommandBuffer)local_338);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_418,vk,(VkDevice)device,0,
                      (VkAllocationCallbacks *)0x0);
    pVVar6 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
    pVVar5 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    stack0xfffffffffffffc18 =
         (VkAllocationCallbacks *)
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    uStack_3e0 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
    ;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_2f8.m_internal == 0) {
      DStack_2f0.m_device = pVVar5;
      DStack_2f0.m_allocator = pVVar6;
      local_2f8.m_internal = HVar3.m_internal;
      DStack_2f0.m_deviceIface = pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_2f0,local_2f8);
      local_2f8.m_internal = local_3f8._0_8_;
      DStack_2f0.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
      DStack_2f0.m_device = (VkDevice)stack0xfffffffffffffc18;
      DStack_2f0.m_allocator = uStack_3e0;
      if (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                   &local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkFence)local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                            m_internal);
      }
    }
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_418,vk,(VkDevice)device,0,
                      (VkAllocationCallbacks *)0x0);
    pVVar6 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
    pVVar5 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    pDVar4 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    stack0xfffffffffffffc18 =
         (VkAllocationCallbacks *)
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    uStack_3e0 = local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
    ;
    local_3f8._0_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_3f8._8_8_ =
         local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_2d8.m_internal == 0) {
      DStack_2d0.m_device = pVVar5;
      DStack_2d0.m_allocator = pVVar6;
      local_2d8.m_internal = HVar3.m_internal;
      DStack_2d0.m_deviceIface = pDVar4;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_2d0,local_2d8);
      DStack_2d0.m_device = (VkDevice)stack0xfffffffffffffc18;
      DStack_2d0.m_allocator = uStack_3e0;
      local_2d8.m_internal = local_3f8._0_8_;
      DStack_2d0.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
      if (local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                   &local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                   (VkFence)local_418.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                            m_internal);
      }
    }
    VVar10 = (*vk->_vptr_DeviceInterface[2])(vk,local_388,1,local_268,local_2f8.m_internal);
    ::vk::checkResult(VVar10,
                      "vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                      ,0xe8);
    VVar10 = (*vk->_vptr_DeviceInterface[2])(vk,local_378,1,local_220,local_2d8.m_internal);
    ::vk::checkResult(VVar10,
                      "vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                      ,0xe9);
    iVar11 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2f8,1,0xffffffffffffffff);
    if (iVar11 == 0) {
      iVar11 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2d8,1,0xffffffffffffffff);
      if (iVar11 == 0) {
        plVar15 = (long *)local_220;
        plVar17 = (long *)local_3f8;
        for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
          *plVar17 = *plVar15;
          plVar15 = plVar15 + (ulong)bVar24 * -2 + 1;
          plVar17 = plVar17 + (ulong)bVar24 * -2 + 1;
        }
        plVar15 = local_268;
        plVar17 = (long *)local_220;
        for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
          *plVar17 = *plVar15;
          plVar15 = plVar15 + (ulong)bVar24 * -2 + 1;
          plVar17 = plVar17 + (ulong)bVar24 * -2 + 1;
        }
        plVar15 = (long *)local_3f8;
        plVar17 = local_268;
        for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
          *plVar17 = *plVar15;
          plVar15 = plVar15 + (ulong)bVar24 * -2 + 1;
          plVar17 = plVar17 + (ulong)bVar24 * -2 + 1;
        }
        local_238 = &local_358;
        local_1f0 = &local_338;
        VVar10 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_2f8);
        ::vk::checkResult(VVar10,"vk.resetFences(*logicalDevice, 1u, &fence[FIRST].get())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                          ,0xf9);
        VVar10 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_2d8);
        ::vk::checkResult(VVar10,"vk.resetFences(*logicalDevice, 1u, &fence[SECOND].get())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                          ,0xfa);
        VVar10 = (*vk->_vptr_DeviceInterface[2])(vk,local_378,1,local_220,local_2d8.m_internal);
        ::vk::checkResult(VVar10,
                          "vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                          ,0xfc);
        VVar10 = (*vk->_vptr_DeviceInterface[2])(vk,local_388,1,local_268,local_2f8.m_internal);
        ::vk::checkResult(VVar10,
                          "vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                          ,0xfd);
        iVar11 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2f8,1,0xffffffffffffffff);
        if (iVar11 == 0) {
          iVar11 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_2d8,1,0xffffffffffffffff);
          pTVar21 = local_390;
          pVVar23 = local_3a8;
          local_3f8._0_8_ = local_3f8 + 0x10;
          if (iVar11 == 0) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,"Basic semaphore tests with multi queue passed","");
            pTVar21->m_code = QP_TEST_RESULT_PASS;
            (pTVar21->m_description)._M_dataplus._M_p = (pointer)&(pTVar21->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pTVar21->m_description,local_3f8._0_8_,
                       (undefined1 *)
                       ((long)(VkQueueFlags *)local_3f8._0_8_ + (long)(_func_int ***)local_3f8._8_8_
                       ));
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,"Basic semaphore tests with multi queue failed","");
            pTVar21->m_code = QP_TEST_RESULT_FAIL;
            (pTVar21->m_description)._M_dataplus._M_p = (pointer)&(pTVar21->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pTVar21->m_description,local_3f8._0_8_,
                       (undefined1 *)
                       ((long)(VkQueueFlags *)local_3f8._0_8_ + (long)(_func_int ***)local_3f8._8_8_
                       ));
          }
        }
        else {
          local_3f8._0_8_ = local_3f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,"Basic semaphore tests with multi queue failed","");
          pTVar21 = local_390;
          pVVar23 = local_3a8;
          local_390->m_code = QP_TEST_RESULT_FAIL;
          (local_390->m_description)._M_dataplus._M_p = (pointer)&(local_390->m_description).field_2
          ;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_390->m_description,local_3f8._0_8_,
                     (undefined1 *)
                     ((long)(VkQueueFlags *)local_3f8._0_8_ + (long)(_func_int ***)local_3f8._8_8_))
          ;
        }
      }
      else {
        local_3f8._0_8_ = local_3f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3f8,"Basic semaphore tests with multi queue failed","");
        pTVar21 = local_390;
        pVVar23 = local_3a8;
        local_390->m_code = QP_TEST_RESULT_FAIL;
        (local_390->m_description)._M_dataplus._M_p = (pointer)&(local_390->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_390->m_description,local_3f8._0_8_,
                   (undefined1 *)
                   ((long)(VkQueueFlags *)local_3f8._0_8_ + (long)(_func_int ***)local_3f8._8_8_));
      }
    }
    else {
      local_3f8._0_8_ = local_3f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f8,"Basic semaphore tests with multi queue failed","");
      pTVar21 = local_390;
      pVVar23 = local_3a8;
      local_390->m_code = QP_TEST_RESULT_FAIL;
      (local_390->m_description)._M_dataplus._M_p = (pointer)&(local_390->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390->m_description,local_3f8._0_8_,
                 (undefined1 *)
                 ((long)(VkQueueFlags *)local_3f8._0_8_ + (long)(_func_int ***)local_3f8._8_8_));
    }
    if ((pointer)local_3f8._0_8_ != (pointer)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_,(ulong)((long)&stack0xfffffffffffffc18->pUserData + 1)
                     );
    }
    lVar22 = 0;
    do {
      obj.m_internal = *(deUint64 *)((long)&local_2d8.m_internal + lVar22);
      if (obj.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                   ((long)&DStack_2d0.m_deviceIface + lVar22),obj);
      }
      *(undefined8 *)((long)&DStack_2d0.m_device + lVar22) = 0;
      *(undefined8 *)((long)&DStack_2d0.m_allocator + lVar22) = 0;
      *(undefined8 *)((long)&local_2d8.m_internal + lVar22) = 0;
      *(undefined8 *)((long)&DStack_2d0.m_deviceIface + lVar22) = 0;
      lVar22 = lVar22 + -0x20;
    } while (lVar22 != -0x40);
    lVar22 = 0x20;
    do {
      if (*(long *)((long)&local_358 + lVar22) != 0) {
        local_268[0] = *(long *)((long)&local_358 + lVar22);
        (**(code **)(**(long **)((long)&plStack_350 + lVar22) + 0x240))
                  (*(long **)((long)&plStack_350 + lVar22),
                   *(undefined8 *)((long)&local_348 + lVar22),
                   *(undefined8 *)((long)&uStack_340 + lVar22),1,local_268);
      }
      *(undefined8 *)((long)&local_348 + lVar22) = 0;
      *(undefined8 *)((long)&uStack_340 + lVar22) = 0;
      *(undefined8 *)((long)&local_358 + lVar22) = 0;
      *(undefined8 *)((long)&plStack_350 + lVar22) = 0;
      lVar22 = lVar22 + -0x20;
    } while (lVar22 != -0x20);
    lVar22 = 0;
    do {
      obj_00.m_internal = *(deUint64 *)((long)&local_298.m_internal + lVar22);
      if (obj_00.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
                   ((long)&DStack_290.m_deviceIface + lVar22),obj_00);
      }
      *(undefined8 *)((long)&DStack_290.m_device + lVar22) = 0;
      *(undefined8 *)((long)&DStack_290.m_allocator + lVar22) = 0;
      *(undefined8 *)((long)&local_298.m_internal + lVar22) = 0;
      *(undefined8 *)((long)&DStack_290.m_deviceIface + lVar22) = 0;
      lVar22 = lVar22 + -0x20;
    } while (lVar22 != -0x40);
    if (local_318.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_310,local_318);
    }
    if (pVVar23 != (pointer)0x0) {
      operator_delete(pVVar23,(long)local_368 - (long)pVVar23);
    }
    if ((pointer)device != (pointer)0x0) {
      (*(code *)local_3a0)(device,local_398);
    }
    return pTVar21;
  }
LAB_007d55e5:
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Queues couldn\'t be created",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
             ,0x9b);
  local_398 = (VkAllocationCallbacks *)0x0;
  local_3a0 = (pointer)0x0;
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus basicMultiQueueCase (Context& context)
{
	enum {NO_MATCH_FOUND = ~((deUint32)0)};
	enum QueuesIndexes {FIRST = 0, SECOND, COUNT};

	struct Queues
	{
		VkQueue		queue;
		deUint32	queueFamilyIndex;
	};


	const DeviceInterface&					vk							= context.getDeviceInterface();
	const InstanceInterface&				instance					= context.getInstanceInterface();
	const VkPhysicalDevice					physicalDevice				= context.getPhysicalDevice();
	vk::Move<vk::VkDevice>					logicalDevice;
	std::vector<VkQueueFamilyProperties>	queueFamilyProperties;
	VkDeviceCreateInfo						deviceInfo;
	VkPhysicalDeviceFeatures				deviceFeatures;
	const float								queuePriorities[COUNT]		= {1.0f, 1.0f};
	VkDeviceQueueCreateInfo					queueInfos[COUNT];
	Queues									queues[COUNT]				=
																		{
																			{DE_NULL, (deUint32)NO_MATCH_FOUND},
																			{DE_NULL, (deUint32)NO_MATCH_FOUND}
																		};
	const VkCommandBufferBeginInfo			info						=
																		{
																			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
																			DE_NULL,										// const void*                              pNext;
																			VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,	// VkCommandBufferUsageFlags                flags;
																			DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
																		};
	Move<VkSemaphore>						semaphore;
	Move<VkCommandPool>						cmdPool[COUNT];
	Move<VkCommandBuffer>					cmdBuffer[COUNT];
	const VkPipelineStageFlags				stageBits[]					= { VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT };
	VkSubmitInfo							submitInfo[COUNT];
	Move<VkFence>							fence[COUNT];

	queueFamilyProperties = getPhysicalDeviceQueueFamilyProperties(instance, physicalDevice);

	for (deUint32 queueNdx = 0; queueNdx < queueFamilyProperties.size(); ++queueNdx)
	{
		if (NO_MATCH_FOUND == queues[FIRST].queueFamilyIndex)
			queues[FIRST].queueFamilyIndex = queueNdx;

		if (queues[FIRST].queueFamilyIndex != queueNdx || queueFamilyProperties[queueNdx].queueCount > 1u)
		{
			queues[SECOND].queueFamilyIndex = queueNdx;
			break;
		}
	}

	if (queues[FIRST].queueFamilyIndex == NO_MATCH_FOUND || queues[SECOND].queueFamilyIndex == NO_MATCH_FOUND)
		TCU_THROW(NotSupportedError, "Queues couldn't be created");

	for (int queueNdx = 0; queueNdx < COUNT; ++queueNdx)
	{
		VkDeviceQueueCreateInfo queueInfo;
		deMemset(&queueInfo, 0, sizeof(queueInfo));

		queueInfo.sType				= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
		queueInfo.pNext				= DE_NULL;
		queueInfo.flags				= (VkDeviceQueueCreateFlags)0u;
		queueInfo.queueFamilyIndex	= queues[queueNdx].queueFamilyIndex;
		queueInfo.queueCount		= (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex) ? 2 : 1;
		queueInfo.pQueuePriorities	= queuePriorities;

		queueInfos[queueNdx]		= queueInfo;

		if (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex)
			break;
	}

	deMemset(&deviceInfo, 0, sizeof(deviceInfo));
	instance.getPhysicalDeviceFeatures(physicalDevice, &deviceFeatures);

	deviceInfo.sType					= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	deviceInfo.pNext					= DE_NULL;
	deviceInfo.enabledExtensionCount	= 0u;
	deviceInfo.ppEnabledExtensionNames	= DE_NULL;
	deviceInfo.enabledLayerCount		= 0u;
	deviceInfo.ppEnabledLayerNames		= DE_NULL;
	deviceInfo.pEnabledFeatures			= &deviceFeatures;
	deviceInfo.queueCreateInfoCount		= (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex) ? 1 : COUNT;
	deviceInfo.pQueueCreateInfos		= queueInfos;

	logicalDevice = vk::createDevice(instance, physicalDevice, &deviceInfo);

	for (deUint32 queueReqNdx = 0; queueReqNdx < COUNT; ++queueReqNdx)
	{
		if (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex)
			vk.getDeviceQueue(*logicalDevice, queues[queueReqNdx].queueFamilyIndex, queueReqNdx, &queues[queueReqNdx].queue);
		else
			vk.getDeviceQueue(*logicalDevice, queues[queueReqNdx].queueFamilyIndex, 0u, &queues[queueReqNdx].queue);
	}

	semaphore			= (createSemaphore (vk, *logicalDevice));
	cmdPool[FIRST]		= (createCommandPool(vk, *logicalDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queues[FIRST].queueFamilyIndex));
	cmdPool[SECOND]		= (createCommandPool(vk, *logicalDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queues[SECOND].queueFamilyIndex));
	cmdBuffer[FIRST]	= (makeCommandBuffer(vk, *logicalDevice, *cmdPool[FIRST]));
	cmdBuffer[SECOND]	= (makeCommandBuffer(vk, *logicalDevice, *cmdPool[SECOND]));

	submitInfo[FIRST].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
	submitInfo[FIRST].pNext					= DE_NULL;
	submitInfo[FIRST].waitSemaphoreCount	= 0u;
	submitInfo[FIRST].pWaitSemaphores		= DE_NULL;
	submitInfo[FIRST].pWaitDstStageMask		= (const VkPipelineStageFlags*)DE_NULL;
	submitInfo[FIRST].commandBufferCount	= 1u;
	submitInfo[FIRST].pCommandBuffers		= &cmdBuffer[FIRST].get();
	submitInfo[FIRST].signalSemaphoreCount	= 1u;
	submitInfo[FIRST].pSignalSemaphores		= &semaphore.get();

	submitInfo[SECOND].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
	submitInfo[SECOND].pNext					= DE_NULL;
	submitInfo[SECOND].waitSemaphoreCount		= 1u;
	submitInfo[SECOND].pWaitSemaphores			= &semaphore.get();
	submitInfo[SECOND].pWaitDstStageMask		= stageBits;
	submitInfo[SECOND].commandBufferCount		= 1u;
	submitInfo[SECOND].pCommandBuffers			= &cmdBuffer[SECOND].get();
	submitInfo[SECOND].signalSemaphoreCount		= 0u;
	submitInfo[SECOND].pSignalSemaphores		= DE_NULL;

	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer[FIRST], &info));
	endCommandBuffer(vk, *cmdBuffer[FIRST]);
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer[SECOND], &info));
	endCommandBuffer(vk, *cmdBuffer[SECOND]);

	fence[FIRST]  = (createFence(vk, *logicalDevice));
	fence[SECOND] = (createFence(vk, *logicalDevice));

	VK_CHECK(vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST]));
	VK_CHECK(vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND]));

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[FIRST].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[SECOND].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	{
		VkSubmitInfo swapInfo				= submitInfo[SECOND];
		submitInfo[SECOND]					= submitInfo[FIRST];
		submitInfo[FIRST]					= swapInfo;
		submitInfo[SECOND].pCommandBuffers	= &cmdBuffer[SECOND].get();
		submitInfo[FIRST].pCommandBuffers	= &cmdBuffer[FIRST].get();
	}

	VK_CHECK(vk.resetFences(*logicalDevice, 1u, &fence[FIRST].get()));
	VK_CHECK(vk.resetFences(*logicalDevice, 1u, &fence[SECOND].get()));

	VK_CHECK(vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND]));
	VK_CHECK(vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST]));

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[FIRST].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[SECOND].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	return tcu::TestStatus::pass("Basic semaphore tests with multi queue passed");
}